

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O0

char * SUNGetErrMsg(SUNErrCode code)

{
  SUNErrCode code_local;
  char *local_8;
  
  switch(code) {
  case -9999:
    local_8 = "argument provided is NULL or corrupted";
    break;
  case -0x270e:
    local_8 = "argument provided is not compatible";
    break;
  case -0x270d:
    local_8 = "argument is out of the valid range";
    break;
  case -0x270c:
    local_8 = "argument provided is not the right type";
    break;
  case -0x270b:
    local_8 = "argument dimensions do not agree";
    break;
  case -0x270a:
    local_8 = "an error occurred";
    break;
  case -0x2709:
    local_8 = "value is NULL or corrupt";
    break;
  case -0x2708:
    local_8 = "Value is out of the expected range";
    break;
  case -0x2707:
    local_8 = "Unable to open file";
    break;
  case -0x2706:
    local_8 = "an operation failed";
    break;
  case -0x2705:
    local_8 = "a memory operation failed";
    break;
  case -0x2704:
    local_8 = "malloc returned NULL";
    break;
  case -0x2703:
    local_8 = "a failure occurred in an external library";
    break;
  case -0x2702:
    local_8 = "a destroy function returned an error";
    break;
  case -0x2701:
    local_8 = "operation is not implemented: function pointer is NULL";
    break;
  case -0x2700:
    local_8 = "the user provided callback function failed";
    break;
  case -0x26ff:
    local_8 = "the number of profiler entries exceeded SUNPROFILER_MAX_ENTRIES";
    break;
  case -0x26fe:
    local_8 = "unknown error getting SUNProfiler timer";
    break;
  case -0x26fd:
    local_8 = "unknown error inserting SUNProfiler timer";
    break;
  case -0x26fc:
    local_8 = "timer was not found in SUNProfiler";
    break;
  case -0x26fb:
    local_8 = "error sorting SUNProfiler map";
    break;
  case -0x26fa:
    local_8 = "SUNContext is NULL or corrupt";
    break;
  case -0x26f9:
    local_8 = "an MPI call returned something other than MPI_SUCCESS";
    break;
  case -0x26f8:
    local_8 = 
    "Reached code that should be unreachable: open an issue at: https://github.com/LLNL/sundials";
    break;
  case -0x26f7:
    local_8 = "Unknown error occured: open an issue at https://github.com/LLNL/sundials";
    break;
  default:
    local_8 = "unknown error";
  }
  return local_8;
}

Assistant:

const char* SUNGetErrMsg(SUNErrCode code)
{
#define SUN_EXPAND_TO_CASES(name, description) \
  case name: return description; break;

  switch (code)
  {
    SUN_ERR_CODE_LIST(SUN_EXPAND_TO_CASES)
  default: return "unknown error";
  }

  return NULL;
}